

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test::
~SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test
          (SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test *this)

{
  StrictMock<solitaire::SDL::WrapperMock> *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_SDLGraphicsSystemWithLoadedTexture).super_SDLGraphicsSystemWithCreatedWindowTests.
  super_SDLGraphicsSystemTests.super_Test._vptr_Test =
       (_func_int **)&PTR__SDLGraphicsSystemTests_0032de48;
  testing::InSequence::~InSequence
            (&(this->super_SDLGraphicsSystemWithLoadedTexture).
              super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.seq);
  SDLGraphicsSystem::~SDLGraphicsSystem
            (&(this->super_SDLGraphicsSystemWithLoadedTexture).
              super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system);
  if (((this->super_SDLGraphicsSystemWithLoadedTexture).
       super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
       isUniquePointerCreated == false) &&
     (pSVar1 = (this->super_SDLGraphicsSystemWithLoadedTexture).
               super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
               rawPointer, pSVar1 != (StrictMock<solitaire::SDL::WrapperMock> *)0x0)) {
    (*(pSVar1->super_WrapperMock).super_Wrapper._vptr_Wrapper[1])();
  }
  this_00 = (this->super_SDLGraphicsSystemWithLoadedTexture).
            super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.
            ptrDeleterMock.
            super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       renderTextureInFullWindowSuccessfully)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   Eq(std::nullopt), Eq(std::nullopt))
    ).WillOnce(Return(success));

    system.renderTextureInFullWindow(textureId0);
    expectQuitSystemWithLoadedTexture();
}